

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

void __thiscall duckdb_re2::DFA::~DFA(DFA *this)

{
  Workq *pWVar1;
  
  pWVar1 = this->q0_;
  if (pWVar1 != (Workq *)0x0) {
    SparseSetT<void>::~SparseSetT(&pWVar1->super_SparseSet);
  }
  operator_delete(pWVar1);
  pWVar1 = this->q1_;
  if (pWVar1 != (Workq *)0x0) {
    SparseSetT<void>::~SparseSetT(&pWVar1->super_SparseSet);
  }
  operator_delete(pWVar1);
  ClearCache(this);
  std::
  _Hashtable<duckdb_re2::DFA::State_*,_duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>,_std::__detail::_Identity,_duckdb_re2::DFA::StateEqual,_duckdb_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->state_cache_)._M_h);
  pthread_rwlock_destroy((pthread_rwlock_t *)&this->cache_mutex_);
  std::unique_ptr<int[],_duckdb_re2::PODArray<int>::Deleter>::~unique_ptr(&(this->stack_).ptr_);
  pthread_rwlock_destroy((pthread_rwlock_t *)&this->mutex_);
  return;
}

Assistant:

DFA::~DFA() {
  delete q0_;
  delete q1_;
  ClearCache();
}